

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::save_state(session_impl *this,entry *eptr,save_state_flags_t flags)

{
  dht_tracker *this_00;
  pointer psVar1;
  element_type *peVar2;
  entry *peVar3;
  dictionary_type *out;
  shared_ptr<libtorrent::plugin> *ext;
  pointer psVar4;
  string_view key;
  string_view key_00;
  string_view key_01;
  entry local_a0;
  settings_pack local_78;
  
  entry::dict_abi_cxx11_(eptr);
  if ((flags.m_val & 1) != 0) {
    key._M_str = "settings";
    key._M_len = 8;
    peVar3 = entry::operator[](eptr,key);
    out = entry::dict_abi_cxx11_(peVar3);
    non_default_settings(&local_78,&this->m_settings);
    save_settings_to_dict(&local_78,out);
    settings_pack::~settings_pack(&local_78);
  }
  if ((flags.m_val & 2) != 0) {
    get_dht_settings((dht_settings *)&local_78,this);
    libtorrent::dht::save_dht_settings(&local_a0,(dht_settings *)&local_78);
    key_00._M_str = "dht";
    key_00._M_len = 3;
    peVar3 = entry::operator[](eptr,key_00);
    entry::operator=(peVar3,&local_a0);
    entry::~entry(&local_a0);
  }
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((byte)((flags.m_val & 4) >> 2) & this_00 != (dht_tracker *)0x0) == 1) {
    libtorrent::dht::dht_tracker::state((dht_state *)&local_78,this_00);
    libtorrent::dht::save_dht_state(&local_a0,(dht_state *)&local_78);
    key_01._M_str = "dht state";
    key_01._M_len = 9;
    peVar3 = entry::operator[](eptr,key_01);
    entry::operator=(peVar3,&local_a0);
    entry::~entry(&local_a0);
    libtorrent::dht::dht_state::~dht_state((dht_state *)&local_78);
  }
  psVar1 = (this->m_ses_extensions)._M_elems[0].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->m_ses_extensions)._M_elems[0].
                super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_plugin[0xb])(peVar2,eptr);
  }
  return;
}

Assistant:

void session_impl::save_state(entry* eptr, save_state_flags_t const flags) const
	{
		TORRENT_ASSERT(is_single_thread());

		entry& e = *eptr;
		// make it a dict
		e.dict();

		if (flags & session::save_settings)
		{
			entry::dictionary_type& sett = e["settings"].dict();
			save_settings_to_dict(non_default_settings(m_settings), sett);
		}

#ifndef TORRENT_DISABLE_DHT
		if (flags & session::save_dht_settings)
		{
			e["dht"] = dht::save_dht_settings(get_dht_settings());
		}

		if (m_dht && (flags & session::save_dht_state))
		{
			e["dht state"] = dht::save_dht_state(m_dht->state());
		}
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->save_state(*eptr);
		}
#endif
	}